

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O3

Test * DepfileParserTestUnifyMixedRulesLF::Create(void)

{
  Test *pTVar1;
  
  pTVar1 = (Test *)operator_new(0x60);
  pTVar1->failed_ = false;
  pTVar1->assertion_failures_ = 0;
  pTVar1->_vptr_Test = (_func_int **)&PTR__DepfileParserTest_001d0770;
  DepfileParser::DepfileParser((DepfileParser *)(pTVar1 + 1),(DepfileParserOptions)0x0);
  pTVar1[4]._vptr_Test = (_func_int **)(pTVar1 + 5);
  pTVar1[4].failed_ = false;
  *(undefined3 *)&pTVar1[4].field_0x9 = 0;
  pTVar1[4].assertion_failures_ = 0;
  *(undefined1 *)&pTVar1[5]._vptr_Test = 0;
  pTVar1->_vptr_Test = (_func_int **)&PTR__DepfileParserTest_001d0528;
  g_current_test = pTVar1;
  return pTVar1;
}

Assistant:

TEST_F(DepfileParserTest, UnifyMixedRulesLF) {
  string err;
  EXPECT_TRUE(Parse("foo: x\\\n"
                    "     y\n"
                    "foo \\\n"
                    "foo: z\n", &err));
  ASSERT_EQ("foo", parser_.out_.AsString());
  ASSERT_EQ(3u, parser_.ins_.size());
  EXPECT_EQ("x", parser_.ins_[0].AsString());
  EXPECT_EQ("y", parser_.ins_[1].AsString());
  EXPECT_EQ("z", parser_.ins_[2].AsString());
}